

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magics.cpp
# Opt level: O0

U64 magics::attacks<(Piece)3>(Square *s,U64 *block)

{
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<std::vector<int,_std::allocator<int>_>_> __l_01;
  bool bVar1;
  int iVar2;
  reference this;
  bool local_1b6;
  bool local_1aa;
  vector<int,_std::allocator<int>_> *local_198;
  Square local_158;
  Square local_154;
  Square local_150;
  Square local_14c;
  int local_148;
  int local_144;
  int to;
  int sqs;
  U64 tmp;
  int *step;
  iterator __end1;
  iterator __begin1;
  value_type *__range1;
  U64 bm;
  int local_108 [4];
  iterator local_f8;
  size_type local_f0;
  allocator<int> local_d1;
  int local_d0 [4];
  iterator local_c0;
  size_type local_b8;
  vector<int,_std::allocator<int>_> *local_b0;
  vector<int,_std::allocator<int>_> local_a8;
  vector<int,_std::allocator<int>_> local_90;
  vector<int,_std::allocator<int>_> local_78;
  vector<int,_std::allocator<int>_> local_60;
  vector<int,_std::allocator<int>_> vStack_48;
  undefined1 local_30 [8];
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  steps;
  U64 *block_local;
  Square *s_local;
  
  bm._6_1_ = 1;
  local_b0 = &local_a8;
  local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  steps.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)block;
  std::vector<int,_std::allocator<int>_>::vector(local_b0);
  local_b0 = &local_90;
  local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::vector(local_b0);
  local_d0[0] = -7;
  local_d0[1] = 7;
  local_d0[2] = 0xfffffff7;
  local_d0[3] = 9;
  local_c0 = local_d0;
  local_b8 = 4;
  local_b0 = &local_78;
  std::allocator<int>::allocator(&local_d1);
  __l_00._M_len = local_b8;
  __l_00._M_array = local_c0;
  std::vector<int,_std::allocator<int>_>::vector(&local_78,__l_00,&local_d1);
  local_108[0] = -1;
  local_108[1] = 1;
  local_108[2] = 0xfffffff8;
  local_108[3] = 8;
  local_f8 = local_108;
  local_f0 = 4;
  local_b0 = &local_60;
  std::allocator<int>::allocator((allocator<int> *)((long)&bm + 7));
  __l._M_len = local_f0;
  __l._M_array = local_f8;
  std::vector<int,_std::allocator<int>_>::vector(&local_60,__l,(allocator<int> *)((long)&bm + 7));
  bm._6_1_ = 0;
  vStack_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)&local_a8;
  vStack_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x4;
  std::allocator<std::vector<int,_std::allocator<int>_>_>::allocator
            ((allocator<std::vector<int,_std::allocator<int>_>_> *)((long)&bm + 5));
  __l_01._M_len =
       (size_type)
       vStack_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  __l_01._M_array =
       (iterator)
       vStack_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)local_30,__l_01,(allocator<std::vector<int,_std::allocator<int>_>_> *)((long)&bm + 5))
  ;
  std::allocator<std::vector<int,_std::allocator<int>_>_>::~allocator
            ((allocator<std::vector<int,_std::allocator<int>_>_> *)((long)&bm + 5));
  local_198 = &vStack_48;
  do {
    local_198 = local_198 + -1;
    std::vector<int,_std::allocator<int>_>::~vector(local_198);
  } while (local_198 != &local_a8);
  std::allocator<int>::~allocator((allocator<int> *)((long)&bm + 7));
  std::allocator<int>::~allocator(&local_d1);
  __range1 = (value_type *)0x0;
  this = std::
         vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
         ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       *)local_30,3);
  __end1 = std::vector<int,_std::allocator<int>_>::begin(this);
  step = (int *)std::vector<int,_std::allocator<int>_>::end(this);
  while (bVar1 = __gnu_cxx::operator==<int_*,_std::vector<int,_std::allocator<int>_>_>
                           (&__end1,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                     *)&step), ((bVar1 ^ 0xffU) & 1) != 0) {
    tmp = (U64)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&__end1);
    _to = 0;
    local_144 = 1;
    while ((_to & (ulong)((steps.
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                         super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start) == 0 && local_144 < 8) {
      local_148 = *s + local_144 * *(int *)tmp;
      local_144 = local_144 + 1;
      bVar1 = util::on_board(&local_148);
      local_1aa = false;
      if (bVar1) {
        local_14c = *s;
        iVar2 = util::col_dist((int *)&local_14c,&local_148);
        local_1aa = false;
        if (iVar2 < 8) {
          local_150 = *s;
          iVar2 = util::row_dist((int *)&local_150,&local_148);
          local_1aa = false;
          if (iVar2 < 8) {
            local_154 = *s;
            bVar1 = util::same_row((int *)&local_154,&local_148);
            local_1b6 = true;
            if (!bVar1) {
              local_158 = *s;
              local_1b6 = util::same_col((int *)&local_158,&local_148);
            }
            local_1aa = local_1b6;
          }
        }
      }
      if (local_1aa != false) {
        _to = 1L << ((byte)local_148 & 0x3f) | _to;
      }
    }
    __range1 = (value_type *)(_to | (ulong)__range1);
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end1);
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)local_30);
  return (U64)__range1;
}

Assistant:

U64 magics::attacks(const Square& s, const U64& block) {
	std::vector< std::vector<int> > steps =
	{ {}, // pawn
		{}, // knight
		{-7, 7, -9, 9}, // bishop
		{-1, 1, -8, 8}  // rook
	};
	U64 bm = 0ULL;
	for (auto& step : steps[p]) {
		U64 tmp = 0ULL;
		int sqs = 1;

		while ((tmp & block) == 0ULL && sqs < 8) {
			int to = s + (sqs++) * step;
			if (util::on_board(to) &&
				util::col_dist(s, to) <= 7 &&
				util::row_dist(s, to) <= 7 &&
				((p == Piece::bishop && util::on_diagonal(s, to)) ||
					(p == Piece::rook && (util::same_row(s, to) || util::same_col(s, to))))) {
				tmp |= (1ULL << to);
			}
		}
		bm |= tmp;
	}
	return bm;
}